

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncloseWorld.cpp
# Opt level: O2

void __thiscall wasm::anon_unknown_160::EncloseWorld::run(EncloseWorld *this,Module *module)

{
  Export *pEVar1;
  uintptr_t uVar2;
  string_view target;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar3;
  pointer puVar4;
  Type TVar5;
  pointer pTVar6;
  Module *pMVar7;
  bool bVar8;
  pointer puVar9;
  Function *this_00;
  undefined1 auVar10 [8];
  Type *pTVar11;
  value_type *__x;
  LocalGet *value;
  RefAs *ref;
  Call *value_00;
  pointer ppEVar12;
  Type this_01;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *ex;
  Type TVar13;
  value_type vVar14;
  Signature SVar15;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar16;
  Name NVar17;
  Iterator IVar18;
  Name name;
  IString local_140;
  HeapType local_130;
  Type *local_128;
  pointer local_120;
  pointer local_118;
  variant<wasm::Name,_wasm::HeapType> *local_110;
  undefined1 auStack_108 [8];
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  newExports;
  char *local_e8;
  HeapType local_e0;
  undefined1 auStack_d8 [8];
  Iterator __begin2;
  value_type local_b0;
  Type externref;
  undefined1 auStack_98 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> stubParams;
  undefined1 auStack_78 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> params;
  Builder local_50;
  Builder builder;
  __uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> local_40;
  Module *local_38;
  
  auStack_108 = (undefined1  [8])0x0;
  newExports.
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  newExports.
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar9 = (module->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_118 = (module->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = module;
  do {
    puVar4 = newExports.
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    auVar10 = auStack_108;
    if (puVar9 == local_118) {
      for (; auVar10 != (undefined1  [8])puVar4; auVar10 = (undefined1  [8])((long)auVar10 + 8)) {
        Module::addExport(local_38,(unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                                   auVar10);
      }
      std::
      vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ::~vector((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 *)auStack_108);
      return;
    }
    pEVar1 = (puVar9->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
             super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
    local_120 = puVar9;
    if (pEVar1->kind == Function) {
      local_110 = &pEVar1->value;
      if (*(__index_type *)
           ((long)&(pEVar1->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) != '\0')
      {
        local_110 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
      }
      TVar13.id = *(uintptr_t *)
                   &(local_110->super__Variant_base<wasm::Name,_wasm::HeapType>).
                    super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                    super__Copy_assign_alias<wasm::Name,_wasm::HeapType>;
      this_00 = Module::getFunction(local_38,(IString)*(IString *)
                                                       &(local_110->
                                                                                                                
                                                  super__Variant_base<wasm::Name,_wasm::HeapType>).
                                                  super__Move_assign_alias<wasm::Name,_wasm::HeapType>
                                                  .
                                                  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>
                                   );
      builder.wasm = (Module *)&this_00->type;
      SVar15 = HeapType::getSignature((HeapType *)builder.wasm);
      auStack_98 = (undefined1  [8])SVar15.params.id;
      auStack_78 = (undefined1  [8])auStack_98;
      params.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      PVar16 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
               wasm::Type::end((Type *)auStack_78);
      ppEVar12 = (pointer)0x0;
      auVar10 = (undefined1  [8])auStack_98;
      while (PVar3.index = (size_t)ppEVar12, PVar3.parent = (Type *)auVar10, PVar16 != PVar3) {
        pTVar11 = wasm::Type::Iterator::operator*((Iterator *)auStack_78);
        bVar8 = isOpenRef((EncloseWorld *)pTVar11->id,TVar13);
        if (bVar8) goto LAB_009e4093;
        ppEVar12 = (pointer)((long)params.
                                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1);
        auVar10 = auStack_78;
        params.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_start = ppEVar12;
      }
      SVar15 = HeapType::getSignature((HeapType *)builder.wasm);
      bVar8 = isOpenRef((EncloseWorld *)SVar15.results.id.id,TVar13);
      if (bVar8) {
LAB_009e4093:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)auStack_98,"stub$",(allocator<char> *)&local_50);
        IString::toString_abi_cxx11_((string *)auStack_d8,(IString *)this_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_98,(string *)auStack_d8);
        IString::IString(&local_140,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_78);
        pMVar7 = local_38;
        NVar17.super_IString.str._M_str = local_140.str._M_str;
        NVar17.super_IString.str._M_len = local_140.str._M_len;
        TVar13.id = local_140.str._M_len;
        NVar17 = Names::getValidFunctionName(local_38,NVar17);
        std::__cxx11::string::~string((string *)auStack_78);
        std::__cxx11::string::~string((string *)auStack_d8);
        std::__cxx11::string::~string((string *)auStack_98);
        local_50.wasm = pMVar7;
        auStack_78 = (undefined1  [8])0x0;
        params.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        params.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b0.id = 10;
        auStack_98 = (undefined1  [8])0x0;
        stubParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        stubParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        SVar15 = HeapType::getSignature((HeapType *)builder.wasm);
        externref = SVar15.params.id;
        auStack_d8 = (undefined1  [8])&externref;
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)0x0;
        IVar18 = wasm::Type::end((Type *)auStack_d8);
        local_128 = IVar18.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                    parent;
        while ((__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                != (Type *)IVar18.
                           super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
               || (auStack_d8 != (undefined1  [8])local_128))) {
          __x = wasm::Type::Iterator::operator*((Iterator *)auStack_d8);
          bVar8 = isOpenRef((EncloseWorld *)__x->id,TVar13);
          pTVar6 = stubParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                   super__Vector_impl_data._M_start;
          auVar10 = auStack_98;
          vVar14.id = local_b0.id;
          if (bVar8) {
            value = MixedArena::alloc<wasm::LocalGet>(&(local_50.wasm)->allocator);
            value->index = (Index)((ulong)((long)pTVar6 - (long)auVar10) >> 3);
            (value->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
                 vVar14.id;
            ref = Builder::makeRefAs(&local_50,AnyConvertExtern,(Expression *)value);
            local_40._M_t.
            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
            super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
                 (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)
                 Builder::makeRefCast(&local_50,(Expression *)ref,(Type)__x->id);
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_78,
                       (Expression **)&local_40);
            __x = &local_b0;
            std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                      ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_98,__x);
          }
          else {
            uVar2 = __x->id;
            local_40._M_t.
            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
            super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
                 (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)
                 MixedArena::alloc<wasm::LocalGet>(&(local_50.wasm)->allocator);
            *(int *)((long)local_40._M_t.
                           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                           .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x10) =
                 (int)((ulong)((long)pTVar6 - (long)auVar10) >> 3);
            ((Type *)((long)local_40._M_t.
                            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                            .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 8))->id =
                 uVar2;
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_78,
                       (Expression **)&local_40);
            std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                      ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_98,__x);
          }
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)((long)&(__begin2.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1);
          TVar13.id = (uintptr_t)__x;
        }
        TVar13.id = (this_00->super_Importable).super_Named.name.super_IString.str._M_len;
        target = (this_00->super_Importable).super_Named.name.super_IString.str;
        SVar15 = HeapType::getSignature((HeapType *)builder.wasm);
        value_00 = Builder::makeCall(&local_50,(Name)target,
                                     (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      *)auStack_78,SVar15.results.id,false);
        SVar15 = HeapType::getSignature((HeapType *)builder.wasm);
        this_01 = SVar15.results.id;
        bVar8 = isOpenRef((EncloseWorld *)this_01.id,TVar13);
        vVar14.id = local_b0.id;
        TVar13.id = (uintptr_t)auStack_98;
        wasm::Type::Type(&externref,(Tuple *)TVar13.id);
        TVar5 = externref;
        if (!bVar8) {
          vVar14.id = this_01.id;
        }
        bVar8 = isOpenRef((EncloseWorld *)this_01.id,TVar13);
        if (bVar8) {
          Builder::makeRefAs(&local_50,ExternConvertAny,(Expression *)value_00);
        }
        SVar15.results.id = vVar14.id;
        SVar15.params.id = TVar5.id;
        HeapType::HeapType(&local_130,SVar15);
        auStack_d8 = (undefined1  [8])0x0;
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)0x0;
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
        local_e8 = NVar17.super_IString.str._M_len;
        local_e0.id = NVar17.super_IString.str._M_str;
        name.super_IString.str._M_str = local_e8;
        name.super_IString.str._M_len = (size_t)&local_40;
        Builder::makeFunction
                  (name,local_e0,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_130.id,
                   (Expression *)auStack_d8);
        Module::addFunction(local_38,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                      *)&local_40);
        std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
                  ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&local_40);
        std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                  ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_d8);
        std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                  ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_98);
        std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                  ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   auStack_78);
        *(char **)&(local_110->super__Variant_base<wasm::Name,_wasm::HeapType>).
                   super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Copy_assign_alias<wasm::Name,_wasm::HeapType> = local_e8;
        *(uintptr_t *)
         ((long)&(local_110->super__Variant_base<wasm::Name,_wasm::HeapType>).
                 super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                 super__Copy_assign_alias<wasm::Name,_wasm::HeapType> + 8) = local_e0.id;
      }
    }
    puVar9 = local_120 + 1;
  } while( true );
}

Assistant:

void run(Module* module) override {
    // Handle exports.
    // TODO: Non-function exports.
    std::vector<std::unique_ptr<Export>> newExports;
    for (auto& ex : module->exports) {
      if (ex->kind == ExternalKind::Function) {
        auto* name = ex->getInternalName();
        auto* func = module->getFunction(*name);
        // If this opens up types, replace it with an enclosed stub.
        if (opensTypes(func)) {
          auto stubName = makeStubStubForExport(func, module);
          *name = stubName;
        }
      }
    }
    for (auto& ex : newExports) {
      module->addExport(std::move(ex));
    }

    // TODO: Handle imports.
  }